

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.cpp
# Opt level: O0

void __thiscall HighsGFkSolve::addNonzero(HighsGFkSolve *this,HighsInt row,HighsInt col,uint val)

{
  bool bVar1;
  size_type sVar2;
  uint *puVar3;
  reference pvVar4;
  reference pvVar5;
  value_type in_ECX;
  value_type in_EDX;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar7;
  value_type in_ESI;
  HighsGFkSolve *in_RDI;
  HighsInt pos;
  value_type_conflict2 *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint local_18;
  
  bVar1 = std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::
          empty((priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_> *)
                0x5e976b);
  if (bVar1) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->Avalue);
    local_18 = (uint)sVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
               (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
              );
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_RDI,
               (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
              );
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_RDI,
               (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
              );
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    uVar6 = extraout_EDX;
    uVar7 = extraout_var;
  }
  else {
    puVar3 = (uint *)std::
                     priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>
                     ::top((priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>
                            *)0x5e984d);
    local_18 = *puVar3;
    std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::pop
              ((priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_> *)
               in_RDI);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->Avalue,(long)(int)local_18);
    *pvVar4 = in_ECX;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Arow,(long)(int)local_18);
    *pvVar5 = in_ESI;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Acol,(long)(int)local_18);
    *pvVar5 = in_EDX;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Aprev,(long)(int)local_18);
    *pvVar5 = -1;
    uVar6 = extraout_EDX_00;
    uVar7 = extraout_var_00;
  }
  link(in_RDI,(char *)(ulong)local_18,(char *)CONCAT44(uVar7,uVar6));
  return;
}

Assistant:

void HighsGFkSolve::addNonzero(HighsInt row, HighsInt col, unsigned int val) {
  assert(findNonzero(row, col) == -1);
  HighsInt pos;
  if (freeslots.empty()) {
    pos = Avalue.size();
    Avalue.push_back(val);
    Arow.push_back(row);
    Acol.push_back(col);
    Anext.push_back(-1);
    Aprev.push_back(-1);
    ARleft.push_back(-1);
    ARright.push_back(-1);
  } else {
    pos = freeslots.top();
    freeslots.pop();
    Avalue[pos] = val;
    Arow[pos] = row;
    Acol[pos] = col;
    Aprev[pos] = -1;
  }

  link(pos);
}